

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
* __thiscall
nlohmann::
json_pointer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::get_checked(json_pointer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              *this,basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *ptr)

{
  string *psVar1;
  int iVar2;
  parse_error *__return_storage_ptr__;
  out_of_range *poVar3;
  long *plVar4;
  size_type *psVar5;
  string *__rhs;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  __rhs = (this->reference_tokens).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->reference_tokens).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (__rhs == psVar1) {
      return ptr;
    }
    if (ptr->m_type == array) {
      iVar2 = std::__cxx11::string::compare((char *)__rhs);
      if (iVar2 == 0) {
        poVar3 = (out_of_range *)__cxa_allocate_exception(0x20);
        std::__cxx11::to_string
                  (&local_48,
                   (long)(((ptr->m_value).array)->
                         super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(((ptr->m_value).array)->
                         super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                         )._M_impl.super__Vector_impl_data._M_start >> 4);
        std::operator+(&local_68,"array index \'-\' (",&local_48);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_68);
        local_88._M_dataplus._M_p = (pointer)*plVar4;
        psVar5 = (size_type *)(plVar4 + 2);
        if ((size_type *)local_88._M_dataplus._M_p == psVar5) {
          local_88.field_2._M_allocated_capacity = *psVar5;
          local_88.field_2._8_8_ = plVar4[3];
          local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        }
        else {
          local_88.field_2._M_allocated_capacity = *psVar5;
        }
        local_88._M_string_length = plVar4[1];
        *plVar4 = (long)psVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        detail::out_of_range::create(poVar3,0x192,&local_88);
        __cxa_throw(poVar3,&detail::out_of_range::typeinfo,detail::exception::~exception);
      }
      if ((1 < __rhs->_M_string_length) && (*(__rhs->_M_dataplus)._M_p == '0')) {
        __return_storage_ptr__ = (parse_error *)__cxa_allocate_exception(0x28);
        std::operator+(&local_68,"array index \'",__rhs);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_68);
        local_88._M_dataplus._M_p = (pointer)*plVar4;
        psVar5 = (size_type *)(plVar4 + 2);
        if ((size_type *)local_88._M_dataplus._M_p == psVar5) {
          local_88.field_2._M_allocated_capacity = *psVar5;
          local_88.field_2._8_8_ = plVar4[3];
          local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        }
        else {
          local_88.field_2._M_allocated_capacity = *psVar5;
        }
        local_88._M_string_length = plVar4[1];
        *plVar4 = (long)psVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        detail::parse_error::create(__return_storage_ptr__,0x6a,0,&local_88);
        __cxa_throw(__return_storage_ptr__,&detail::parse_error::typeinfo,
                    detail::exception::~exception);
      }
      iVar2 = array_index(__rhs);
      ptr = basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::at(ptr,(long)iVar2);
    }
    else {
      if (ptr->m_type != object) {
        poVar3 = (out_of_range *)__cxa_allocate_exception(0x20);
        std::operator+(&local_68,"unresolved reference token \'",__rhs);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_68);
        local_88._M_dataplus._M_p = (pointer)*plVar4;
        psVar5 = (size_type *)(plVar4 + 2);
        if ((size_type *)local_88._M_dataplus._M_p == psVar5) {
          local_88.field_2._M_allocated_capacity = *psVar5;
          local_88.field_2._8_8_ = plVar4[3];
          local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        }
        else {
          local_88.field_2._M_allocated_capacity = *psVar5;
        }
        local_88._M_string_length = plVar4[1];
        *plVar4 = (long)psVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        detail::out_of_range::create(poVar3,0x194,&local_88);
        __cxa_throw(poVar3,&detail::out_of_range::typeinfo,detail::exception::~exception);
      }
      ptr = basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::at(ptr,__rhs);
    }
    __rhs = __rhs + 1;
  } while( true );
}

Assistant:

const BasicJsonType& get_checked(const BasicJsonType* ptr) const {
		using size_type = typename BasicJsonType::size_type;
		for (const auto& reference_token : reference_tokens) {
			switch (ptr->m_type) {
				case detail::value_t::object: {
					// note: at performs range check
					ptr = &ptr->at(reference_token);
					break;
				}

				case detail::value_t::array: {
					if (JSON_UNLIKELY(reference_token == "-")) {
						// "-" always fails the range check
						JSON_THROW(detail::out_of_range::create(
							402,
							"array index '-' (" + std::to_string(ptr->m_value.array->size()) + ") is out of range"));
					}

					// error condition (cf. RFC 6901, Sect. 4)
					if (JSON_UNLIKELY(reference_token.size() > 1 and reference_token[0] == '0')) {
						JSON_THROW(detail::parse_error::create(
							106, 0, "array index '" + reference_token + "' must not begin with '0'"));
					}

					// note: at performs range check
					JSON_TRY { ptr = &ptr->at(static_cast<size_type>(array_index(reference_token))); }
					JSON_CATCH(std::invalid_argument&) {
						JSON_THROW(detail::parse_error::create(
							109, 0, "array index '" + reference_token + "' is not a number"));
					}
					break;
				}

				default:
					JSON_THROW(
						detail::out_of_range::create(404, "unresolved reference token '" + reference_token + "'"));
			}